

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O2

void __thiscall skiwi::anon_unknown_23::compile_fixture::compile_fixture(compile_fixture *this)

{
  context *__dest;
  _Rb_tree_header *p_Var1;
  fun_ptr f;
  uint64_t size;
  asmcode code;
  logic_error e;
  _func_unsigned_long_void_ptr_varargs *local_1c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>_>
  *local_1b8;
  ulong local_1b0;
  undefined8 local_1a8 [6];
  first_pass_data local_178 [2];
  
  this->_vptr_compile_fixture = (_func_int **)&PTR__compile_fixture_001f5268;
  skiwi::compiler_options::compiler_options(&this->ops);
  skiwi::repl_data::repl_data(&this->rd);
  p_Var1 = &(this->md).m._M_t._M_impl.super__Rb_tree_header;
  (this->md).m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->md).m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->md).m._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->md).m._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->compiled_functions).
  super__Vector_base<std::pair<unsigned_long_(*)(void_*,____),_unsigned_long>,_std::allocator<std::pair<unsigned_long_(*)(void_*,____),_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compiled_functions).
  super__Vector_base<std::pair<unsigned_long_(*)(void_*,____),_unsigned_long>,_std::allocator<std::pair<unsigned_long_(*)(void_*,____),_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compiled_functions).
  super__Vector_base<std::pair<unsigned_long_(*)(void_*,____),_unsigned_long>,_std::allocator<std::pair<unsigned_long_(*)(void_*,____),_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->pm)._M_t._M_impl.super__Rb_tree_header;
  (this->pm)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pm)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->md).m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->md).compiled_macros.
  super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->md).compiled_macros.
  super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->md).compiled_macros.
  super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->env).
  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->env).
  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pm)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pm)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pm)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b8 = &this->externals;
  p_Var1 = &(this->externals)._M_t._M_impl.super__Rb_tree_header;
  (this->externals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->externals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->externals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->externals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->externals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  skiwi::add_system_calls((map *)local_1b8);
  this->stream_out = false;
  skiwi::create_context((ulong)local_178,0x100000,0x400,0x400);
  __dest = &this->ctxt;
  memcpy(__dest,local_178,0x140);
  local_1a8[0] = 0;
  std::make_shared<skiwi::environment<skiwi::environment_entry>,decltype(nullptr)>
            ((void **)local_178);
  std::__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&(this->env).
             super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
            ,(__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
              *)local_178);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178[0].data_size);
  assembler::asmcode::asmcode((asmcode *)local_1a8);
  skiwi::compile_primitives_library
            ((map *)&this->pm,&this->rd,(shared_ptr *)&this->env,__dest,(asmcode *)local_1a8,
             &this->ops);
  local_178[0].label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178[0].label_to_address._M_t._M_impl.super__Rb_tree_header._M_header;
  local_178[0].label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178[0].label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_178[0].size = 0;
  local_178[0].data_size = 0;
  local_178[0].label_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178[0].external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178[0].external_to_address._M_t._M_impl.super__Rb_tree_header._M_header;
  local_178[0].external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178[0].external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_178[0].external_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178[0].label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178[0].label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_178[0].external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178[0].external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1c0 = (_func_unsigned_long_void_ptr_varargs *)
              assembler::assemble(&local_1b0,local_178,(asmcode *)local_1a8);
  (*local_1c0)(__dest);
  std::
  vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
  ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
            ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
              *)&this->compiled_functions,&local_1c0,&local_1b0);
  skiwi::assign_primitive_addresses((map *)&this->pm,local_178,(ulong)local_1c0);
  assembler::first_pass_data::~first_pass_data(local_178);
  assembler::asmcode::~asmcode((asmcode *)local_1a8);
  return;
}

Assistant:

compile_fixture()
      {
      add_system_calls(externals);
      stream_out = false;
      ctxt = create_context(1024 * 1024, 1024, 1024, 1024);
      env = std::make_shared<environment<environment_entry>>(nullptr);
      //rd = repl_data();

      asmcode code;
      try
        {
        compile_primitives_library(pm, rd, env, ctxt, code, ops);
        digest_asmcode(code);
        first_pass_data d;
        uint64_t size;
        fun_ptr f = (fun_ptr)assemble(size, d, code);
        f(&ctxt);
        compiled_functions.emplace_back(f, size);
        assign_primitive_addresses(pm, d, (uint64_t)f);
        }
      catch (std::logic_error e)
        {
        std::cout << e.what() << " while compiling primitives library\n\n";
        }
      }